

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  uchar ***pppuVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int itemsize;
  int iVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar13;
  uchar *puVar14;
  uchar *extraout_RDX_01;
  undefined4 in_register_00000034;
  uchar *puVar15;
  uchar **ppuVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint uStack_200ac;
  uint uStack_200a8;
  uint uStack_200a4;
  uchar *puStack_200a0;
  ulong uStack_20098;
  byte *pbStack_20090;
  uchar *puStack_20088;
  uchar *puStack_20080;
  uchar *puStack_20078;
  ulong uStack_20070;
  int iStack_20068;
  int iStack_20064;
  ulong uStack_20060;
  int *piStack_20058;
  size_t sStack_20050;
  ulong uStack_20048;
  uchar ***pppuStack_20040;
  uchar **hash_table [16384];
  
  uStack_20098 = CONCAT44(in_register_00000034,data_len);
  puStack_200a0 = (uchar *)0x0;
  uStack_20060 = 5;
  if (5 < quality) {
    uStack_20060 = (ulong)(uint)quality;
  }
  puStack_20088 = data;
  piStack_20058 = out_len;
  stbiw__sbgrowf(&puStack_200a0,1,(int)out_len);
  iVar19 = *(int *)(puStack_200a0 + -4);
  *(int *)(puStack_200a0 + -4) = iVar19 + 1;
  puStack_200a0[iVar19] = 'x';
  iVar11 = *(int *)(puStack_200a0 + -4);
  iVar19 = iVar11 + 1;
  if (*(int *)(puStack_200a0 + -8) <= iVar19) {
    stbiw__sbgrowf(&puStack_200a0,1,itemsize);
    iVar11 = *(int *)(puStack_200a0 + -4);
    iVar19 = iVar11 + 1;
  }
  *(int *)(puStack_200a0 + -4) = iVar19;
  puStack_200a0[iVar11] = '^';
  uStack_200ac = 1;
  uStack_200a8 = uStack_200ac;
  puVar8 = stbiw__zlib_flushf(puStack_200a0,&uStack_200a8,(int *)&uStack_200ac);
  uStack_200a8 = uStack_200a8 | 1 << ((byte)uStack_200ac & 0x1f);
  uStack_200ac = uStack_200ac + 2;
  puVar8 = stbiw__zlib_flushf(puVar8,&uStack_200a8,(int *)&uStack_200ac);
  for (lVar9 = 0; lVar9 != 0x4000; lVar9 = lVar9 + 1) {
    hash_table[lVar9] = (uchar **)0x0;
  }
  iStack_20064 = (int)uStack_20098 + -3;
  iStack_20068 = (int)uStack_20060 * 2;
  uStack_20048 = uStack_20060 & 0xffffffff;
  sStack_20050 = uStack_20048 * 8;
  uVar18 = 0;
  puStack_200a0 = puVar8;
  while (iVar19 = (int)uVar18, iVar19 < iStack_20064) {
    pbStack_20090 = puStack_20088 + iVar19;
    puStack_20078 = puVar8;
    uVar5 = stbiw__zhash(pbStack_20090);
    ppuVar16 = hash_table[uVar5 & 0x3fff];
    if (ppuVar16 == (uchar **)0x0) {
      lVar9 = 0;
    }
    else {
      lVar9 = (long)*(int *)((long)ppuVar16 + -4);
    }
    pppuStack_20040 = hash_table + (uVar5 & 0x3fff);
    iVar11 = (int)uStack_20098;
    if (lVar9 < 1) {
      lVar9 = 0;
    }
    uStack_200a4 = 3;
    puStack_20080 = (uchar *)0x0;
    uVar13 = extraout_RDX;
    uStack_20070 = uVar18;
    for (lVar17 = 0; pbVar1 = pbStack_20090, iVar12 = (int)uVar13, lVar9 != lVar17;
        lVar17 = lVar17 + 1) {
      puVar8 = ppuVar16[lVar17];
      if ((long)(iVar19 + -0x8000) < (long)puVar8 - (long)puStack_20088) {
        uVar6 = stbiw__zlib_countm(puVar8,pbStack_20090,iVar11 - iVar19);
        uVar5 = uStack_200a4;
        if ((int)uStack_200a4 < (int)uVar6) {
          uVar5 = uVar6;
        }
        bVar3 = (int)uStack_200a4 <= (int)uVar6;
        uVar13 = extraout_RDX_00;
        uStack_200a4 = uVar5;
        if (bVar3) {
          puStack_20080 = puVar8;
        }
      }
    }
    if (ppuVar16 == (uchar **)0x0) {
LAB_001c426b:
      pppuVar4 = pppuStack_20040;
      stbiw__sbgrowf(pppuStack_20040,8,iVar12);
      ppuVar16 = *pppuVar4;
      iVar19 = *(int *)((long)ppuVar16 + -4);
      iVar11 = iVar19 + 1;
    }
    else {
      iVar19 = *(int *)((long)ppuVar16 + -4);
      if (iVar19 == iStack_20068) {
        memmove(ppuVar16,ppuVar16 + uStack_20048,sStack_20050);
        iVar19 = (int)uStack_20060;
        *(int *)((long)ppuVar16 + -4) = iVar19;
        iVar12 = extraout_EDX;
      }
      iVar11 = iVar19 + 1;
      if (*(int *)(ppuVar16 + -1) <= iVar11) goto LAB_001c426b;
    }
    *(int *)((long)ppuVar16 + -4) = iVar11;
    ppuVar16[iVar19] = pbVar1;
    if (puStack_20080 == (uchar *)0x0) {
LAB_001c4314:
      bVar2 = *pbStack_20090;
      if (bVar2 < 0x90) {
        iVar19 = stbiw__zlib_bitrev(bVar2 + 0x30,8);
        uStack_200a8 = uStack_200a8 | iVar19 << ((byte)uStack_200ac & 0x1f);
        uStack_200ac = uStack_200ac + 8;
      }
      else {
        iVar19 = stbiw__zlib_bitrev(bVar2 | 0x100,9);
        uStack_200a8 = uStack_200a8 | iVar19 << ((byte)uStack_200ac & 0x1f);
        uStack_200ac = uStack_200ac + 9;
      }
      uVar5 = 1;
      puVar8 = puStack_20078;
LAB_001c44db:
      puVar8 = stbiw__zlib_flushf(puVar8,&uStack_200a8,(int *)&uStack_200ac);
    }
    else {
      pbVar1 = pbStack_20090 + 1;
      uVar5 = stbiw__zhash(pbVar1);
      ppuVar16 = hash_table[uVar5 & 0x3fff];
      if (ppuVar16 == (uchar **)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(uint *)((long)ppuVar16 + -4);
      }
      uVar6 = (uint)uStack_20070;
      iVar19 = ~uVar6 + (int)uStack_20098;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      for (uVar18 = 0; uVar5 != uVar18; uVar18 = uVar18 + 1) {
        if (((long)(int)(uVar6 - 0x7fff) < (long)ppuVar16[uVar18] - (long)puStack_20088) &&
           (uVar7 = stbiw__zlib_countm(ppuVar16[uVar18],pbVar1,iVar19),
           (int)uStack_200a4 < (int)uVar7)) goto LAB_001c4314;
      }
      iVar19 = (int)pbStack_20090 - (int)puStack_20080;
      if ((0x7fff < iVar19) || (0x102 < (int)uStack_200a4)) {
        __assert_fail("d <= 32767 && best <= 258",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image_write/stb_image_write.h"
                      ,0x304,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)");
      }
      uVar18 = 0;
      do {
        uVar10 = uVar18;
        uVar18 = uVar10 + 1;
      } while ((int)(uint)stbi_zlib_compress::lengthc[uVar10 + 1] <= (int)uStack_200a4);
      iVar11 = (int)(uVar10 + 1);
      if (uVar10 < 0x17) {
        iVar11 = stbiw__zlib_bitrev(iVar11,7);
        uStack_200a8 = uStack_200a8 | iVar11 << ((byte)uStack_200ac & 0x1f);
        uStack_200ac = uStack_200ac + 7;
      }
      else {
        iVar11 = stbiw__zlib_bitrev(iVar11 + 0xa8,8);
        uStack_200a8 = uStack_200a8 | iVar11 << ((byte)uStack_200ac & 0x1f);
        uStack_200ac = uStack_200ac + 8;
      }
      puVar8 = stbiw__zlib_flushf(puStack_20078,&uStack_200a8,(int *)&uStack_200ac);
      uVar5 = uStack_200a4;
      uVar10 = uVar10 & 0xffffffff;
      if (0xffffffffffffffeb < uVar10 - 0x1c) {
        uStack_200a8 = uStack_200a8 |
                       uStack_200a4 - stbi_zlib_compress::lengthc[uVar10] <<
                       ((byte)uStack_200ac & 0x1f);
        uStack_200ac = ""[uVar10] + uStack_200ac;
        puVar8 = stbiw__zlib_flushf(puVar8,&uStack_200a8,(int *)&uStack_200ac);
      }
      uVar18 = 0xffffffffffffffff;
      do {
        lVar9 = uVar18 + 2;
        uVar18 = uVar18 + 1;
      } while ((int)(uint)stbi_zlib_compress::distc[lVar9] <= iVar19);
      iVar11 = stbiw__zlib_bitrev((int)uVar18,5);
      uStack_200a8 = uStack_200a8 | iVar11 << ((byte)uStack_200ac & 0x1f);
      uStack_200ac = uStack_200ac + 5;
      puVar8 = stbiw__zlib_flushf(puVar8,&uStack_200a8,(int *)&uStack_200ac);
      if (3 < uVar18) {
        uStack_200a8 = uStack_200a8 |
                       iVar19 - (uint)stbi_zlib_compress::distc[uVar18 & 0xffffffff] <<
                       ((byte)uStack_200ac & 0x1f);
        uStack_200ac = ""[uVar18 & 0xffffffff] + uStack_200ac;
        goto LAB_001c44db;
      }
    }
    uVar18 = (ulong)(uVar5 + (int)uStack_20070);
  }
  lVar17 = (long)(int)uStack_20098;
  puStack_200a0 = puVar8;
  for (lVar9 = (long)iVar19; lVar9 < lVar17; lVar9 = lVar9 + 1) {
    bVar2 = puStack_20088[lVar9];
    if (bVar2 < 0x90) {
      iVar19 = stbiw__zlib_bitrev(bVar2 + 0x30,8);
      uStack_200a8 = uStack_200a8 | iVar19 << ((byte)uStack_200ac & 0x1f);
      uStack_200ac = uStack_200ac + 8;
    }
    else {
      iVar19 = stbiw__zlib_bitrev(bVar2 | 0x100,9);
      uStack_200a8 = uStack_200a8 | iVar19 << ((byte)uStack_200ac & 0x1f);
      uStack_200ac = uStack_200ac + 9;
    }
    puVar8 = stbiw__zlib_flushf(puVar8,&uStack_200a8,(int *)&uStack_200ac);
  }
  puStack_200a0 = puVar8;
  iVar19 = stbiw__zlib_bitrev(0,7);
  uStack_200a8 = uStack_200a8 | iVar19 << ((byte)uStack_200ac & 0x1f);
  uVar5 = uStack_200ac + 7;
  do {
    uStack_200ac = uVar5;
    puVar8 = stbiw__zlib_flushf(puVar8,&uStack_200a8,(int *)&uStack_200ac);
    uVar5 = uStack_200ac + 1;
  } while (uStack_200ac != 0);
  puStack_200a0 = puVar8;
  for (lVar9 = 0; lVar9 != 0x4000; lVar9 = lVar9 + 1) {
    if (hash_table[lVar9] != (uchar **)0x0) {
      free(hash_table[lVar9] + -1);
    }
  }
  puVar15 = (uchar *)((long)((ulong)(uint)((int)uStack_20098 >> 0x1f) << 0x20 |
                            uStack_20098 & 0xffffffff) % 0x15b0 & 0xffffffff);
  uVar5 = 1;
  uVar6 = 0;
  puVar14 = puVar15;
  for (iVar19 = 0; iVar19 < (int)uStack_20098; iVar19 = iVar19 + iVar11) {
    iVar11 = (int)puVar15;
    puVar14 = (uchar *)0x0;
    if (0 < iVar11) {
      puVar14 = puVar15;
    }
    for (puVar15 = (uchar *)0x0; puVar14 != puVar15; puVar15 = puVar15 + 1) {
      uVar5 = uVar5 + (puStack_20088 + iVar19)[(long)puVar15];
      uVar6 = uVar6 + uVar5;
    }
    uVar5 = uVar5 % 0xfff1;
    puVar14 = (uchar *)((ulong)uVar6 % 0xfff1);
    puVar15 = (uchar *)0x15b0;
    uVar6 = (uint)puVar14;
  }
  if (puVar8 != (uchar *)0x0) {
    iVar11 = *(int *)(puVar8 + -4);
    iVar19 = iVar11 + 1;
    puVar14 = puVar8;
    if (iVar19 < *(int *)(puVar8 + -8)) goto LAB_001c4683;
  }
  stbiw__sbgrowf(&puStack_200a0,1,(int)puVar14);
  iVar11 = *(int *)(puStack_200a0 + -4);
  iVar19 = iVar11 + 1;
  puVar8 = puStack_200a0;
LAB_001c4683:
  *(int *)(puVar8 + -4) = iVar19;
  puVar8[iVar11] = (uchar)(uVar6 >> 8);
  if (*(int *)(puVar8 + -8) <= *(int *)(puVar8 + -4) + 1) {
    stbiw__sbgrowf(&puStack_200a0,1,(int)puVar8);
    puVar8 = extraout_RDX_01;
  }
  iVar12 = (int)puVar8;
  iVar19 = *(int *)(puStack_200a0 + -4);
  *(int *)(puStack_200a0 + -4) = iVar19 + 1;
  puStack_200a0[iVar19] = (uchar)uVar6;
  iVar11 = *(int *)(puStack_200a0 + -4);
  iVar19 = iVar11 + 1;
  if (*(int *)(puStack_200a0 + -8) <= iVar19) {
    stbiw__sbgrowf(&puStack_200a0,1,iVar12);
    iVar11 = *(int *)(puStack_200a0 + -4);
    iVar19 = iVar11 + 1;
    iVar12 = extraout_EDX_00;
  }
  *(int *)(puStack_200a0 + -4) = iVar19;
  puStack_200a0[iVar11] = (uchar)(uVar5 >> 8);
  iVar11 = *(int *)(puStack_200a0 + -4);
  iVar19 = iVar11 + 1;
  if (*(int *)(puStack_200a0 + -8) <= iVar19) {
    stbiw__sbgrowf(&puStack_200a0,1,iVar12);
    iVar11 = *(int *)(puStack_200a0 + -4);
    iVar19 = iVar11 + 1;
  }
  *(int *)(puStack_200a0 + -4) = iVar19;
  puStack_200a0[iVar11] = (uchar)uVar5;
  iVar19 = *(int *)(puStack_200a0 + -4);
  *piStack_20058 = iVar19;
  puVar8 = (uchar *)memmove(puStack_200a0 + -8,puStack_200a0,(long)iVar19);
  return puVar8;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char **hash_table[stbiw__ZHASH]; // 64KB on the stack!
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, (unsigned char) (s2 >> 8));
      stbiw__sbpush(out, (unsigned char) s2);
      stbiw__sbpush(out, (unsigned char) (s1 >> 8));
      stbiw__sbpush(out, (unsigned char) s1);
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}